

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O0

void __thiscall
Fixpp::impl::
FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<73U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<14U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<151U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<84U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<6U,_Fixpp::Type::Float>_>,_Fixpp::TagT<103U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>_>
::Visitor::Visitor(Visitor *this,ParsingContext *context,GroupSet *groupSet,bool strict,
                  bool skipUnknown)

{
  bool skipUnknown_local;
  bool strict_local;
  GroupSet *groupSet_local;
  ParsingContext *context_local;
  Visitor *this_local;
  
  this->recursive = false;
  this->context = context;
  this->groupSet = groupSet;
  this->strict = strict;
  this->skipUnknown = skipUnknown;
  return;
}

Assistant:

Visitor(ParsingContext& context, GroupSet& groupSet, bool strict, bool skipUnknown)
                    : recursive(false)
                    , context(context)
                    , groupSet(groupSet)
                    , strict(strict)
                    , skipUnknown(skipUnknown)
                    
                { }